

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlAttribute::SetDoubleValue(TiXmlAttribute *this,double _value)

{
  char local_118 [8];
  char buf [256];
  double _value_local;
  TiXmlAttribute *this_local;
  
  buf._248_8_ = _value;
  snprintf(local_118,0x100,"%lf",_value);
  SetValue(this,local_118);
  return;
}

Assistant:

void TiXmlAttribute::SetDoubleValue(double _value) {
	char buf[256];
#if defined(TIXML_SNPRINTF)
	TIXML_SNPRINTF(buf, sizeof(buf), "%lf", _value);
#else
	sprintf (buf, "%lf", _value);
#endif
	SetValue(buf);
}